

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int nonce_function_bip340
              (uchar *nonce32,uchar *msg,size_t msglen,uchar *key32,uchar *xonly_pk32,uchar *algo,
              size_t algolen,void *data)

{
  int iVar1;
  int local_cc;
  byte local_c8 [4];
  int i;
  uchar masked_key [32];
  secp256k1_sha256 sha;
  uchar *algo_local;
  uchar *xonly_pk32_local;
  uchar *key32_local;
  size_t msglen_local;
  uchar *msg_local;
  uchar *nonce32_local;
  
  if (algo == (uchar *)0x0) {
    nonce32_local._4_4_ = 0;
  }
  else {
    if (data == (void *)0x0) {
      for (local_cc = 0; local_cc < 0x20; local_cc = local_cc + 1) {
        local_c8[local_cc] = key32[local_cc] ^ nonce_function_bip340::ZERO_MASK[local_cc];
      }
    }
    else {
      secp256k1_nonce_function_bip340_sha256_tagged_aux((secp256k1_sha256 *)(masked_key + 0x18));
      secp256k1_sha256_write((secp256k1_sha256 *)(masked_key + 0x18),(uchar *)data,0x20);
      secp256k1_sha256_finalize((secp256k1_sha256 *)(masked_key + 0x18),local_c8);
      for (local_cc = 0; local_cc < 0x20; local_cc = local_cc + 1) {
        local_c8[local_cc] = local_c8[local_cc] ^ key32[local_cc];
      }
    }
    if ((algolen == 0xd) && (iVar1 = secp256k1_memcmp_var(algo,"BIP0340/nonce",0xd), iVar1 == 0)) {
      secp256k1_nonce_function_bip340_sha256_tagged((secp256k1_sha256 *)(masked_key + 0x18));
    }
    else {
      secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)(masked_key + 0x18),algo,algolen);
    }
    secp256k1_sha256_write((secp256k1_sha256 *)(masked_key + 0x18),local_c8,0x20);
    secp256k1_sha256_write((secp256k1_sha256 *)(masked_key + 0x18),xonly_pk32,0x20);
    secp256k1_sha256_write((secp256k1_sha256 *)(masked_key + 0x18),msg,msglen);
    secp256k1_sha256_finalize((secp256k1_sha256 *)(masked_key + 0x18),nonce32);
    nonce32_local._4_4_ = 1;
  }
  return nonce32_local._4_4_;
}

Assistant:

static int nonce_function_bip340(unsigned char *nonce32, const unsigned char *msg, size_t msglen, const unsigned char *key32, const unsigned char *xonly_pk32, const unsigned char *algo, size_t algolen, void *data) {
    secp256k1_sha256 sha;
    unsigned char masked_key[32];
    int i;

    if (algo == NULL) {
        return 0;
    }

    if (data != NULL) {
        secp256k1_nonce_function_bip340_sha256_tagged_aux(&sha);
        secp256k1_sha256_write(&sha, data, 32);
        secp256k1_sha256_finalize(&sha, masked_key);
        for (i = 0; i < 32; i++) {
            masked_key[i] ^= key32[i];
        }
    } else {
        /* Precomputed TaggedHash("BIP0340/aux", 0x0000...00); */
        static const unsigned char ZERO_MASK[32] = {
              84, 241, 105, 207, 201, 226, 229, 114,
             116, 128,  68,  31, 144, 186,  37, 196,
             136, 244,  97, 199,  11,  94, 165, 220,
             170, 247, 175, 105, 39,  10, 165,  20
        };
        for (i = 0; i < 32; i++) {
            masked_key[i] = key32[i] ^ ZERO_MASK[i];
        }
    }

    /* Tag the hash with algo which is important to avoid nonce reuse across
     * algorithms. If this nonce function is used in BIP-340 signing as defined
     * in the spec, an optimized tagging implementation is used. */
    if (algolen == sizeof(bip340_algo)
            && secp256k1_memcmp_var(algo, bip340_algo, algolen) == 0) {
        secp256k1_nonce_function_bip340_sha256_tagged(&sha);
    } else {
        secp256k1_sha256_initialize_tagged(&sha, algo, algolen);
    }

    /* Hash masked-key||pk||msg using the tagged hash as per the spec */
    secp256k1_sha256_write(&sha, masked_key, 32);
    secp256k1_sha256_write(&sha, xonly_pk32, 32);
    secp256k1_sha256_write(&sha, msg, msglen);
    secp256k1_sha256_finalize(&sha, nonce32);
    return 1;
}